

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.cpp
# Opt level: O0

void __thiscall GcHeap::GcHeapImpl::VerifyHeap(GcHeapImpl *this)

{
  __node_base_ptr *pp_Var1;
  value_type this_00;
  bool bVar2;
  reference ppSVar3;
  size_type sVar4;
  pair<std::__detail::_Node_iterator<Sexp_*,_true,_false>,_bool> pVar5;
  anon_class_8_1_a8a4b1a8 local_d8;
  function<void_(Sexp_**)> local_d0;
  _Node_iterator_base<Sexp_*,_false> local_b0;
  undefined1 local_a8;
  value_type local_a0;
  Sexp *ptr;
  Sexp **it;
  iterator __end1;
  iterator __begin1;
  list<Sexp_*,_std::allocator<Sexp_*>_> *__range1;
  undefined1 local_60 [8];
  unordered_set<Sexp_*,_std::hash<Sexp_*>,_std::equal_to<Sexp_*>,_std::allocator<Sexp_*>_> visited;
  vector<Sexp_*,_std::allocator<Sexp_*>_> stack;
  GcHeapImpl *this_local;
  
  DebugLog("[%d] verifying heap",this->gc_number);
  pp_Var1 = &visited._M_h._M_single_bucket;
  std::vector<Sexp_*,_std::allocator<Sexp_*>_>::vector
            ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)pp_Var1);
  std::unordered_set<Sexp_*,_std::hash<Sexp_*>,_std::equal_to<Sexp_*>,_std::allocator<Sexp_*>_>::
  unordered_set((unordered_set<Sexp_*,_std::hash<Sexp_*>,_std::equal_to<Sexp_*>,_std::allocator<Sexp_*>_>
                 *)local_60);
  ScanRoots<GcHeap::GcHeapImpl::VerifyHeap()::_lambda(Sexp**)_1_>((anon_class_8_1_a8a4b1a8)pp_Var1);
  __end1 = std::__cxx11::list<Sexp_*,_std::allocator<Sexp_*>_>::begin(&this->finalize_queue);
  it = (Sexp **)std::__cxx11::list<Sexp_*,_std::allocator<Sexp_*>_>::end(&this->finalize_queue);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&it), bVar2) {
    ptr = (Sexp *)std::_List_iterator<Sexp_*>::operator*(&__end1);
    std::vector<Sexp_*,_std::allocator<Sexp_*>_>::push_back
              ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)&visited._M_h._M_single_bucket,
               (value_type *)ptr);
    std::_List_iterator<Sexp_*>::operator++(&__end1);
  }
  while( true ) {
    do {
      bVar2 = std::vector<Sexp_*,_std::allocator<Sexp_*>_>::empty
                        ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)&visited._M_h._M_single_bucket);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        std::
        unordered_set<Sexp_*,_std::hash<Sexp_*>,_std::equal_to<Sexp_*>,_std::allocator<Sexp_*>_>::
        ~unordered_set((unordered_set<Sexp_*,_std::hash<Sexp_*>,_std::equal_to<Sexp_*>,_std::allocator<Sexp_*>_>
                        *)local_60);
        std::vector<Sexp_*,_std::allocator<Sexp_*>_>::~vector
                  ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)&visited._M_h._M_single_bucket);
        return;
      }
      pp_Var1 = &visited._M_h._M_single_bucket;
      ppSVar3 = std::vector<Sexp_*,_std::allocator<Sexp_*>_>::back
                          ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)pp_Var1);
      local_a0 = *ppSVar3;
      std::vector<Sexp_*,_std::allocator<Sexp_*>_>::pop_back
                ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)pp_Var1);
      sVar4 = std::
              unordered_set<Sexp_*,_std::hash<Sexp_*>,_std::equal_to<Sexp_*>,_std::allocator<Sexp_*>_>
              ::count((unordered_set<Sexp_*,_std::hash<Sexp_*>,_std::equal_to<Sexp_*>,_std::allocator<Sexp_*>_>
                       *)local_60,&local_a0);
    } while (sVar4 != 0);
    pVar5 = std::
            unordered_set<Sexp_*,_std::hash<Sexp_*>,_std::equal_to<Sexp_*>,_std::allocator<Sexp_*>_>
            ::insert((unordered_set<Sexp_*,_std::hash<Sexp_*>,_std::equal_to<Sexp_*>,_std::allocator<Sexp_*>_>
                      *)local_60,&local_a0);
    this_00 = local_a0;
    local_b0._M_cur = (__node_type *)pVar5.first.super__Node_iterator_base<Sexp_*,_false>._M_cur;
    local_a8 = pVar5.second;
    bVar2 = false;
    if (((Sexp *)this->heap_start <= local_a0) &&
       (bVar2 = false, local_a0 <= (Sexp *)this->heap_end)) {
      bVar2 = true;
    }
    if (!bVar2) break;
    if (local_a0->padding == 0xabababababababab) {
      __assert_fail("ptr->padding != 0xabababababababab && \"observed a pointer that has been relocated!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp"
                    ,0x19b,"void GcHeap::GcHeapImpl::VerifyHeap()");
    }
    local_d8.stack = (vector<Sexp_*,_std::allocator<Sexp_*>_> *)&visited._M_h._M_single_bucket;
    std::function<void(Sexp**)>::function<GcHeap::GcHeapImpl::VerifyHeap()::_lambda(Sexp**)_2_,void>
              ((function<void(Sexp**)> *)&local_d0,&local_d8);
    Sexp::TracePointers(this_00,&local_d0);
    std::function<void_(Sexp_**)>::~function(&local_d0);
  }
  __assert_fail("(uint8_t *)ptr >= heap_start && (uint8_t *)ptr <= heap_end && \"pointer not in heap!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp"
                ,0x199,"void GcHeap::GcHeapImpl::VerifyHeap()");
}

Assistant:

void VerifyHeap() {
// The basic idea here is to traverse the entire
// heap and verify that every pointer is 1) within
// the valid heap range (i.e. we didn't accidentally introduce
// any wild pointers during a GC) and to ensure that every pointer
// points to a non-relocated object.
//
// When an object is relocated in a debug build, it is replaced
// with the bit pattern 0xab - if we see a pointer here that
// observes that bit pattern, we know that we failed to update
// a pointer somewhere.
#ifdef DEBUG
    DebugLog("[%d] verifying heap", gc_number);
    std::vector<Sexp *> stack;
    std::unordered_set<Sexp *> visited;
    ScanRoots([&](Sexp **ptr) {
      if (ptr == nullptr || *ptr == nullptr) {
        return;
      }

      if ((*ptr)->IsEmpty()) {
        return;
      }

      stack.push_back(*ptr);
    });

    // make sure we relocated the finalize queue right
    for (auto &it : finalize_queue) {
      stack.push_back(it);
    }

    while (!stack.empty()) {
      Sexp *ptr = stack.back();
      stack.pop_back();
      if (visited.count(ptr) != 0) {
        continue;
      }

      visited.insert(ptr);
      assert((uint8_t *)ptr >= heap_start && (uint8_t *)ptr <= heap_end &&
             "pointer not in heap!");
      assert(ptr->padding != 0xabababababababab &&
             "observed a pointer that has been relocated!");
      ptr->TracePointers([&](Sexp **child) {
        assert(child != nullptr && "passed a null pointer to TracePointers!");
        assert(*child != nullptr && "observed a null pointer!");
        if ((*child)->IsEmpty()) {
          return;
        }

        stack.push_back(*child);
      });

      // DebugLog("heap verify: object %s is reachable",
      // ptr->DumpString().c_str());
    }
#endif
  }